

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Constant * __thiscall
LLVMBC::ConstantDataArray::getElementAsConstant(ConstantDataArray *this,uint index)

{
  ValueKind VVar1;
  Constant *this_00;
  LoggingCallback p_Var2;
  void *pvVar3;
  char acStack_1018 [4104];
  
  for (this_00 = (Constant *)
                 (this->elements).
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[index];
      VVar1 = (this_00->super_Value).kind, VVar1 == Proxy;
      this_00 = (Constant *)ValueProxy::get_proxy_value((ValueProxy *)this_00)) {
  }
  if ((VVar1 < ShuffleVector) && ((0x800001f7aU >> ((ulong)VVar1 & 0x3f) & 1) != 0)) {
    return this_00;
  }
  p_Var2 = ::dxil_spv::get_thread_log_callback();
  if (p_Var2 == (LoggingCallback)0x0) {
    getElementAsConstant();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var2)(pvVar3,Error,acStack_1018);
  std::terminate();
}

Assistant:

Constant *ConstantDataArray::getElementAsConstant(unsigned index) const
{
	return cast<Constant>(elements[index]);
}